

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O0

void __thiscall bal::Formula::add_parameter(Formula *this,string *key,string *name,uint32_t value)

{
  __cxx11 local_48 [36];
  uint32_t local_24;
  string *psStack_20;
  uint32_t value_local;
  string *name_local;
  string *key_local;
  Formula *this_local;
  
  local_24 = value;
  psStack_20 = name;
  name_local = key;
  key_local = (string *)this;
  std::__cxx11::to_string(local_48,value);
  add_parameter(this,key,name,(string *)local_48,false);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void Formula::add_parameter(const std::string& key, const std::string& name, const uint32_t value) {
        add_parameter(key, name, std::to_string(value), false);
    }